

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestCases.cpp
# Opt level: O0

void Test13(void)

{
  assert_throws_failure_exception *this;
  exception *anon_var_0_13;
  assert_throws_failure_exception *atf_13;
  exception *anon_var_0_12;
  assert_throws_failure_exception *atf_12;
  exception *anon_var_0_11;
  assert_throws_failure_exception *atf_11;
  exception *anon_var_0_10;
  assert_throws_failure_exception *atf_10;
  exception *anon_var_0_9;
  assert_throws_failure_exception *atf_9;
  exception *anon_var_0_8;
  assert_throws_failure_exception *atf_8;
  exception *anon_var_0_7;
  assert_throws_failure_exception *atf_7;
  exception *anon_var_0_6;
  assert_throws_failure_exception *atf_6;
  exception *anon_var_0_5;
  assert_throws_failure_exception *atf_5;
  exception *anon_var_0_4;
  assert_throws_failure_exception *atf_4;
  exception *anon_var_0_3;
  assert_throws_failure_exception *atf_3;
  exception *anon_var_0_2;
  assert_throws_failure_exception *atf_2;
  exception *anon_var_0_1;
  assert_throws_failure_exception *atf_1;
  exception *anon_var_0;
  assert_throws_failure_exception *atf;
  string local_90;
  allocator<char> local_69;
  string local_68;
  allocator<char> local_31;
  string local_30;
  anon_class_1_0_00000001 local_9 [8];
  anon_class_1_0_00000001 test;
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_30,"",&local_31);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_68,"?",&local_69);
  Test13::anon_class_1_0_00000001::operator()(local_9,&local_30,&local_68);
  std::__cxx11::string::~string((string *)&local_68);
  std::allocator<char>::~allocator(&local_69);
  std::__cxx11::string::~string((string *)&local_30);
  std::allocator<char>::~allocator(&local_31);
  atf._6_1_ = 1;
  this = (assert_throws_failure_exception *)__cxa_allocate_exception(0x48);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_90,
             "\" expecting \" \"test(\\\"\\\", \\\"?\\\")\" \" to throw \" \"std::exception\"",
             (allocator<char> *)((long)&atf + 7));
  cute::do_not_use_this_namespace::assert_throws_failure_exception::assert_throws_failure_exception
            (this,&local_90,
             "/workspace/llm4binary/github/license_all_cmakelists_25/TETYYS[P]ConfusableMatcher/UnitTests/TestCases.cpp"
             ,0x193);
  atf._6_1_ = 0;
  __cxa_throw(this,&cute::do_not_use_this_namespace::assert_throws_failure_exception::typeinfo,
              cute::do_not_use_this_namespace::assert_throws_failure_exception::
              ~assert_throws_failure_exception);
}

Assistant:

void Test13()
{
	auto test = [](std::string k, std::string v)
	{
		std::vector<std::pair<std::string, std::string>> map;
		map.push_back(std::pair(k, v));
		auto matcher = ConfusableMatcher(map, { });
	};

	ASSERT_THROWS(test("", "?"), std::exception);
	ASSERT_THROWS(test("?", ""), std::exception);
	ASSERT_THROWS(test("", ""), std::exception);
	ASSERT_THROWS(test(std::string("\x00", 1), "?"), std::exception);
	ASSERT_THROWS(test("?", std::string("\x00", 1)), std::exception);
	ASSERT_THROWS(test(std::string("\x01", 1), "?"), std::exception);
	ASSERT_THROWS(test("?", std::string("\x01", 1)), std::exception);
	ASSERT_THROWS(test(std::string("\x00", 1), std::string("\x01", 1)), std::exception);
	ASSERT_THROWS(test(std::string("\x00", 1), std::string("\x00", 1)), std::exception);
	ASSERT_THROWS(test(std::string("\x01", 1), std::string("\x00", 1)), std::exception);
	ASSERT_THROWS(test(std::string("\x01", 1), std::string("\x01", 1)), std::exception);
	ASSERT_THROWS(test(std::string("\x01\x00", 2), std::string("\x00\x01", 2)), std::exception);
	ASSERT_THROWS(test(std::string("A\x00", 2), std::string("\x00""A", 2)), std::exception);
	ASSERT_THROWS(test(std::string("\x01\x00", 2), std::string("\x00\x01", 2)), std::exception);
	test(std::string("A\x00", 2), std::string("A\x01", 2));
	test(std::string("A\x01", 2), std::string("A\x00", 2));
	test(std::string("A\x00", 2), std::string("A\x00", 2));
	test(std::string("A\x01", 2), std::string("A\x01", 2));
}